

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_test.c
# Opt level: O0

void simple_test(int converter,double src_ratio)

{
  uint uVar1;
  int error_00;
  char *pcVar2;
  double dVar3;
  double local_70;
  int terminate;
  int error;
  int output_len;
  int input_len;
  SRC_DATA src_data;
  double src_ratio_local;
  int converter_local;
  
  src_data.src_ratio = src_ratio;
  printf("\tsimple_test\t(SRC ratio = %6.4f) ................. ",src_ratio);
  fflush(_stdout);
  if (src_data.src_ratio < 1.0) {
    error = 0x800;
    dVar3 = floor(src_data.src_ratio * 2048.0);
    terminate = (int)dVar3;
  }
  else {
    terminate = 0x800;
    dVar3 = floor(2048.0 / src_data.src_ratio);
    error = (int)dVar3;
  }
  uVar1 = error - 10;
  if (0x800 < terminate) {
    printf("\n\nLine %d : output_len > BUFFER_LEN\n\n",0x87);
    exit(1);
  }
  memset(&output_len,0,0x40);
  _output_len = simple_test::input;
  src_data.data_out = (float *)(long)(int)uVar1;
  src_data._48_8_ = src_data.src_ratio;
  src_data.data_in = simple_test::output;
  src_data.input_frames = 0x800;
  error_00 = src_simple((SRC_DATA *)&output_len,converter,1);
  if (error_00 != 0) {
    pcVar2 = src_strerror(error_00);
    printf("\n\nLine %d : %s\n\n",0x96,pcVar2);
    exit(1);
  }
  if (src_data.src_ratio < 1.0) {
    local_70 = 1.0 / src_data.src_ratio;
  }
  else {
    local_70 = src_data.src_ratio;
  }
  dVar3 = ceil(local_70);
  if ((double)((int)dVar3 << 1) <
      ABS(-src_data.src_ratio * (double)(int)uVar1 + (double)src_data.input_frames_used)) {
    dVar3 = floor(src_data.src_ratio * (double)(int)uVar1);
    printf("\n\nLine %d : bad output data length %ld should be %d.\n",0x9d,
           src_data.input_frames_used,(ulong)(uint)(int)dVar3);
    printf("\tsrc_ratio  : %.4f\n",src_data.src_ratio);
    printf("\tinput_len  : %d\n\toutput_len : %d\n\n",(ulong)uVar1,(ulong)(uint)terminate);
    exit(1);
  }
  puts("ok");
  return;
}

Assistant:

static void
simple_test (int converter, double src_ratio)
{	static float input [BUFFER_LEN], output [BUFFER_LEN] ;

	SRC_DATA	src_data ;

	int input_len, output_len, error, terminate ;

	printf ("\tsimple_test\t(SRC ratio = %6.4f) ................. ", src_ratio) ;
	fflush (stdout) ;

	/* Calculate maximun input and output lengths. */
	if (src_ratio >= 1.0)
	{	output_len = BUFFER_LEN ;
		input_len = (int) floor (BUFFER_LEN / src_ratio) ;
		}
	else
	{	input_len = BUFFER_LEN ;
		output_len = (int) floor (BUFFER_LEN * src_ratio) ;
		} ;

	/* Reduce input_len by 10 so output is longer than necessary. */
	input_len -= 10 ;

	if (output_len > BUFFER_LEN)
	{	printf ("\n\nLine %d : output_len > BUFFER_LEN\n\n", __LINE__) ;
		exit (1) ;
		} ;

	memset (&src_data, 0, sizeof (src_data)) ;

	src_data.data_in = input ;
	src_data.input_frames = input_len ;

	src_data.src_ratio = src_ratio ;

	src_data.data_out = output ;
	src_data.output_frames = BUFFER_LEN ;

	if ((error = src_simple (&src_data, converter, 1)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	terminate = (int) ceil ((src_ratio >= 1.0) ? src_ratio : 1.0 / src_ratio) ;

	if (fabs (src_data.output_frames_gen - src_ratio * input_len) > 2 * terminate)
	{	printf ("\n\nLine %d : bad output data length %ld should be %d.\n", __LINE__,
					src_data.output_frames_gen, (int) floor (src_ratio * input_len)) ;
		printf ("\tsrc_ratio  : %.4f\n", src_ratio) ;
		printf ("\tinput_len  : %d\n\toutput_len : %d\n\n", input_len, output_len) ;
		exit (1) ;
		} ;

	puts ("ok") ;

	return ;
}